

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O2

void findDeclaredFunctions(Module *module,Program *program)

{
  char cVar1;
  bool bVar2;
  Module *pMVar3;
  Function *llvmFunc;
  StringRef RHS;
  StringRef SVar4;
  StringRef local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (pMVar3 = module + 0x20; pMVar3 = *(Module **)pMVar3, pMVar3 != module + 0x18;
      pMVar3 = pMVar3 + 8) {
    llvmFunc = (Function *)(pMVar3 + -0x38);
    if (pMVar3 == (Module *)0x0) {
      llvmFunc = (Function *)0x0;
    }
    if (((byte)llvmFunc[0x17] & 0x10) != 0) {
      cVar1 = llvm::GlobalValue::isDeclaration();
      if ((cVar1 != '\0') || ((*(uint *)(llvmFunc + 0x20) & 0xf) == 7)) {
        SVar4 = (StringRef)llvm::Value::getName();
        local_80 = SVar4;
        llvm::StringRef::str_abi_cxx11_(&local_70,&local_80);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
        bVar2 = std::operator!=(&local_50,"llvm.dbg");
        if (bVar2) {
          SVar4 = (StringRef)llvm::Value::getName();
          RHS.Length = 5;
          RHS.Data = "isnan";
          bVar2 = llvm::operator!=(SVar4,RHS);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar2) {
            bVar2 = Program::isFunctionDeclared(program,llvmFunc);
            if (!bVar2) {
              declareFunc(llvmFunc,program);
            }
          }
        }
        else {
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      cVar1 = llvm::GlobalValue::isDeclaration();
      if (cVar1 == '\0') {
        bVar2 = Program::isFunctionDeclared(program,llvmFunc);
        if (!bVar2) {
          declareFunc(llvmFunc,program);
        }
      }
    }
  }
  Program::addPass(program,FindDeclaredFunctions);
  return;
}

Assistant:

void findDeclaredFunctions(const llvm::Module *module, Program& program) {
    for(const llvm::Function& func : module->functions()) {
        if (func.hasName()) {
            if (func.isDeclaration() || llvm::Function::isInternalLinkage(func.getLinkage())) {
                if (func.getName().str().substr(0, 8) != "llvm.dbg" && func.getName() != "isnan") {
                    if (!program.isFunctionDeclared(&func)) {
                        declareFunc(&func, program);
                    }
                }
            }

            if (!func.isDeclaration()) {
                if (!program.isFunctionDeclared(&func)) {
                    declareFunc(&func, program);
                }
            }
        }
    }

    program.addPass(PassType::FindDeclaredFunctions);
}